

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

bool util::parseTime(string *in,timespec *ts)

{
  char *__s;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  time_t tVar4;
  runtime_error *this;
  int *in_R9;
  int dec;
  tm tm;
  char local_7c [4];
  string local_78;
  tm local_58;
  
  __s = (in->_M_dataplus)._M_p;
  local_58.tm_isdst = 0;
  local_58._36_4_ = 0;
  local_58.tm_gmtoff = 0;
  local_58.tm_mon = 0;
  local_58.tm_year = 0;
  local_58.tm_wday = 0;
  local_58.tm_yday = 0;
  local_58.tm_sec = 0;
  local_58.tm_min = 0;
  local_58.tm_hour = 0;
  local_58.tm_mday = 0;
  local_58.tm_zone = (char *)0x0;
  pcVar3 = strptime(__s,"%Y-%m-%dT%H:%M:%S",&local_58);
  if (pcVar3 < __s + in->_M_string_length) {
    if (*pcVar3 == '.') {
      local_78._M_dataplus._M_p._0_4_ = 0;
      iVar2 = __isoc99_sscanf(pcVar3,".%dZ");
      if ((iVar2 == 1) && ((int)local_78._M_dataplus._M_p < 10)) {
        ts->tv_nsec = 100000000;
        goto LAB_00195c1b;
      }
    }
    bVar1 = false;
  }
  else {
LAB_00195c1b:
    tVar4 = mktime(&local_58);
    if (tVar4 < 1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_7c[0] = '3';
      local_7c[1] = '\0';
      local_7c[2] = '\0';
      local_7c[3] = '\0';
      str<char[29],char[90],char[2],int>
                (&local_78,(util *)"Assertion `t > 0` failed at ",
                 (char (*) [29])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/util/time.cc"
                 ,(char (*) [90])0x1b1e61,(char (*) [2])local_7c,in_R9);
      std::runtime_error::runtime_error(this,(string *)&local_78);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ts->tv_sec = tVar4;
    ts->tv_nsec = 0;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool parseTime(const std::string& in, struct timespec* ts) {
  const char* buf = in.c_str();
  struct tm tm;

  // Initialize tm struct to 0s before using it, otherwise mktime will behave unpredictably - Kons
  memset(&tm, 0x0, sizeof(tm));

  long int tv_nsec = 0;

  // For example: 2017-12-21T17:46:32.2Z
  char* pos = strptime(buf, "%Y-%m-%dT%H:%M:%S", &tm);
  if (pos < (buf + in.size())) {
    if (pos[0] == '.') {
      // Expect single decimal for fractional second
      int dec = 0;
      int num = sscanf(pos, ".%dZ", &dec);
      if (num == 1 && dec < 10) {
        ts->tv_nsec = num * 100000000;
      } else {
        return false;
      }
    } else {
      return false;
    }
  }

  auto t = mktime(&tm);

  // The resulting t should always be greater 0, otherwise there was a problem with date conversion
  ASSERT(t > 0);

  ts->tv_sec = t;
  ts->tv_nsec = tv_nsec;
  return true;
}